

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O3

void __thiscall
cmLocalGenerator::OutputLinkLibraries
          (cmLocalGenerator *this,string *linkLibraries,string *frameworkPath,string *linkPath,
          cmGeneratorTarget *tgt,bool relink,bool forResponseFile,bool useWatcomQuote)

{
  cmOutputConverter *pcVar1;
  cmMakefile *pcVar2;
  pointer pcVar3;
  size_type sVar4;
  pointer pcVar5;
  bool bVar6;
  TargetType TVar7;
  PolicyStatus PVar8;
  char *pcVar9;
  cmComputeLinkInformation *pcVar10;
  cmState *this_00;
  ostream *poVar11;
  char *__s;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar12;
  ItemVector *pIVar13;
  size_t sVar14;
  PolicyID id;
  PolicyID id_00;
  string *psVar15;
  undefined7 in_register_00000089;
  pointer pbVar16;
  pointer pIVar17;
  string standardLibsVar;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  runtimeDirs;
  string linkLibs;
  string linkLanguage;
  string libPathTerminator;
  string fwSearchFlagVar;
  string libPathFlag;
  string config;
  ostringstream fout;
  string local_450;
  cmLocalGenerator *local_430;
  cmComputeLinkInformation *local_428;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_420;
  OutputFormat local_400;
  undefined4 local_3fc;
  undefined1 local_3f8 [40];
  string *local_3d0;
  char *local_3c8;
  char *local_3c0;
  char local_3b8;
  undefined7 uStack_3b7;
  long *local_3a8 [2];
  long local_398 [2];
  string *local_388;
  long *local_380 [2];
  long local_370 [2];
  undefined1 local_360 [112];
  ios_base local_2f0 [264];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  string local_1c8;
  undefined1 local_1a8 [376];
  
  local_3fc = (undefined4)CONCAT71(in_register_00000089,relink);
  local_400 = RESPONSE;
  if (!forResponseFile) {
    local_400 = useWatcomQuote | SHELL;
  }
  local_3d0 = frameworkPath;
  local_388 = linkLibraries;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  pcVar2 = this->Makefile;
  pcVar5 = local_360 + 0x10;
  local_430 = this;
  local_360._0_8_ = pcVar5;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_360,"CMAKE_BUILD_TYPE","");
  pcVar9 = cmMakefile::GetSafeDefinition(pcVar2,(string *)local_360);
  std::__cxx11::string::string((string *)&local_1c8,pcVar9,(allocator *)&local_3c8);
  if ((pointer)local_360._0_8_ != pcVar5) {
    operator_delete((void *)local_360._0_8_,local_360._16_8_ + 1);
  }
  pcVar10 = cmGeneratorTarget::GetLinkInformation(tgt,&local_1c8);
  if (pcVar10 == (cmComputeLinkInformation *)0x0) goto LAB_002cba26;
  local_3c8 = &local_3b8;
  local_3c0 = (char *)0x0;
  local_3b8 = '\0';
  local_3a8[0] = local_398;
  pcVar3 = (pcVar10->LinkLanguage)._M_dataplus._M_p;
  local_428 = pcVar10;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_3a8,pcVar3,pcVar3 + (pcVar10->LinkLanguage)._M_string_length);
  pcVar2 = local_430->Makefile;
  local_360._0_8_ = pcVar5;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_360,"CMAKE_LIBRARY_PATH_FLAG","");
  pcVar9 = cmMakefile::GetRequiredDefinition(pcVar2,(string *)local_360);
  std::__cxx11::string::string((string *)&local_1e8,pcVar9,(allocator *)local_380);
  if ((pointer)local_360._0_8_ != pcVar5) {
    operator_delete((void *)local_360._0_8_,local_360._16_8_ + 1);
  }
  pcVar2 = local_430->Makefile;
  local_360._0_8_ = pcVar5;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_360,"CMAKE_LIBRARY_PATH_TERMINATOR","");
  pcVar9 = cmMakefile::GetSafeDefinition(pcVar2,(string *)local_360);
  std::__cxx11::string::string((string *)local_380,pcVar9,(allocator *)&local_450);
  if ((pointer)local_360._0_8_ != pcVar5) {
    operator_delete((void *)local_360._0_8_,local_360._16_8_ + 1);
  }
  TVar7 = cmGeneratorTarget::GetType(tgt);
  if (TVar7 != EXECUTABLE) goto switchD_002cafc0_default;
  this_00 = cmState::Snapshot::GetState(&local_430->StateSnapshot);
  local_360._0_8_ = pcVar5;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_360,"TARGET_SUPPORTS_SHARED_LIBS","");
  bVar6 = cmState::GetGlobalPropertyAsBool(this_00,(string *)local_360);
  if ((pointer)local_360._0_8_ != pcVar5) {
    operator_delete((void *)local_360._0_8_,local_360._16_8_ + 1);
  }
  if (!bVar6) goto switchD_002cafc0_default;
  PVar8 = cmPolicies::PolicyMap::Get(&tgt->PolicyMap,CMP0065);
  switch(PVar8) {
  case WARN:
    local_360._0_8_ = pcVar5;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_360,"ENABLE_EXPORTS","");
    bVar6 = cmGeneratorTarget::GetPropertyAsBool(tgt,(string *)local_360);
    if (bVar6) {
      bVar6 = false;
    }
    else {
      pcVar2 = local_430->Makefile;
      local_450._M_dataplus._M_p = (pointer)&local_450.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_450,"CMAKE_POLICY_WARNING_CMP0065","");
      bVar6 = cmMakefile::PolicyOptionalWarningEnabled(pcVar2,&local_450);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_450._M_dataplus._M_p != &local_450.field_2) {
        operator_delete(local_450._M_dataplus._M_p,
                        CONCAT71(local_450.field_2._M_allocated_capacity._1_7_,
                                 local_450.field_2._M_local_buf[0]) + 1);
      }
    }
    if ((pointer)local_360._0_8_ != pcVar5) {
      operator_delete((void *)local_360._0_8_,local_360._16_8_ + 1);
    }
    if (bVar6 != false) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_360);
      cmPolicies::GetPolicyWarning_abi_cxx11_(&local_450,(cmPolicies *)0x41,id_00);
      poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_360,local_450._M_dataplus._M_p,
                           local_450._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar11,
                 "\nFor compatibility with older versions of CMake, additional flags may be added to export symbols on all executables regardless of thier ENABLE_EXPORTS property."
                 ,0xa0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_450._M_dataplus._M_p != &local_450.field_2) {
        operator_delete(local_450._M_dataplus._M_p,
                        CONCAT71(local_450.field_2._M_allocated_capacity._1_7_,
                                 local_450.field_2._M_local_buf[0]) + 1);
      }
      pcVar2 = local_430->Makefile;
      std::__cxx11::stringbuf::str();
      cmMakefile::IssueMessage(pcVar2,AUTHOR_WARNING,&local_450,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_450._M_dataplus._M_p != &local_450.field_2) {
        operator_delete(local_450._M_dataplus._M_p,
                        CONCAT71(local_450.field_2._M_allocated_capacity._1_7_,
                                 local_450.field_2._M_local_buf[0]) + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_360);
      std::ios_base::~ios_base(local_2f0);
    }
  case OLD:
switchD_002cafc0_caseD_0:
    local_360._0_8_ = pcVar5;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_360,"CMAKE_SHARED_LIBRARY_LINK_","");
    std::__cxx11::string::_M_append(local_360,(ulong)local_3a8[0]);
    std::__cxx11::string::append(local_360);
    __s = cmMakefile::GetSafeDefinition(local_430->Makefile,(string *)local_360);
    pcVar9 = local_3c0;
    strlen(__s);
    std::__cxx11::string::_M_replace((ulong)&local_3c8,0,pcVar9,(ulong)__s);
    std::__cxx11::string::append((char *)&local_3c8);
    if ((pointer)local_360._0_8_ != pcVar5) {
      operator_delete((void *)local_360._0_8_,local_360._16_8_ + 1);
    }
    break;
  case NEW:
    goto switchD_002cafc0_caseD_2;
  case REQUIRED_IF_USED:
  case REQUIRED_ALWAYS:
    pcVar2 = local_430->Makefile;
    cmPolicies::GetRequiredPolicyError_abi_cxx11_((string *)local_360,(cmPolicies *)0x41,id);
    cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,(string *)local_360,false);
    if ((pointer)local_360._0_8_ != pcVar5) {
      operator_delete((void *)local_360._0_8_,local_360._16_8_ + 1);
    }
switchD_002cafc0_caseD_2:
    local_360._0_8_ = pcVar5;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_360,"ENABLE_EXPORTS","");
    bVar6 = cmGeneratorTarget::GetPropertyAsBool(tgt,(string *)local_360);
    if ((pointer)local_360._0_8_ != pcVar5) {
      operator_delete((void *)local_360._0_8_,local_360._16_8_ + 1);
    }
    if (bVar6) goto switchD_002cafc0_caseD_0;
    break;
  default:
    break;
  }
switchD_002cafc0_default:
  local_360._0_8_ = pcVar5;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_360,"CMAKE_","");
  std::__cxx11::string::_M_append(local_360,(ulong)local_3a8[0]);
  std::__cxx11::string::append(local_360);
  pcVar9 = cmMakefile::GetDefinition(local_430->Makefile,(string *)local_360);
  if ((pcVar9 != (char *)0x0) && (*pcVar9 != '\0')) {
    pvVar12 = cmComputeLinkInformation::GetFrameworkPaths_abi_cxx11_(local_428);
    pbVar16 = (pvVar12->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    if (pbVar16 !=
        (pvVar12->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish) {
      pcVar1 = &local_430->super_cmOutputConverter;
      do {
        std::__cxx11::string::append((char *)local_3d0);
        cmOutputConverter::Convert(&local_450,pcVar1,pbVar16,NONE,local_400);
        std::__cxx11::string::_M_append((char *)local_3d0,(ulong)local_450._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_450._M_dataplus._M_p != &local_450.field_2) {
          operator_delete(local_450._M_dataplus._M_p,
                          CONCAT71(local_450.field_2._M_allocated_capacity._1_7_,
                                   local_450.field_2._M_local_buf[0]) + 1);
        }
        std::__cxx11::string::append((char *)local_3d0);
        pbVar16 = pbVar16 + 1;
      } while (pbVar16 !=
               (pvVar12->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish);
    }
  }
  pvVar12 = cmComputeLinkInformation::GetDirectories_abi_cxx11_(local_428);
  pbVar16 = (pvVar12->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if (pbVar16 !=
      (pvVar12->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    pcVar1 = &local_430->super_cmOutputConverter;
    do {
      cmOutputConverter::ConvertToOutputForExisting
                (&local_450,pcVar1,pbVar16,START_OUTPUT,local_400);
      std::operator+(&local_420," ",&local_1e8);
      std::__cxx11::string::_M_append((char *)linkPath,(ulong)local_420._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_420._M_dataplus._M_p != &local_420.field_2) {
        operator_delete(local_420._M_dataplus._M_p,local_420.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::string::_M_append((char *)linkPath,(ulong)local_450._M_dataplus._M_p);
      std::__cxx11::string::_M_append((char *)linkPath,(ulong)local_380[0]);
      std::__cxx11::string::append((char *)linkPath);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_450._M_dataplus._M_p != &local_450.field_2) {
        operator_delete(local_450._M_dataplus._M_p,
                        CONCAT71(local_450.field_2._M_allocated_capacity._1_7_,
                                 local_450.field_2._M_local_buf[0]) + 1);
      }
      pbVar16 = pbVar16 + 1;
    } while (pbVar16 !=
             (pvVar12->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish);
  }
  pIVar13 = cmComputeLinkInformation::GetItems(local_428);
  pIVar17 = (pIVar13->
            super__Vector_base<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if (pIVar17 !=
      (pIVar13->
      super__Vector_base<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    do {
      if ((pIVar17->Target == (cmGeneratorTarget *)0x0) ||
         (TVar7 = cmGeneratorTarget::GetType(pIVar17->Target), TVar7 != INTERFACE_LIBRARY)) {
        if (pIVar17->IsPath == true) {
          (*local_430->_vptr_cmLocalGenerator[0xd])(&local_450,local_430,pIVar17);
          std::__cxx11::string::_M_append((char *)&local_3c8,(ulong)local_450._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_450._M_dataplus._M_p != &local_450.field_2) {
            operator_delete(local_450._M_dataplus._M_p,
                            CONCAT71(local_450.field_2._M_allocated_capacity._1_7_,
                                     local_450.field_2._M_local_buf[0]) + 1);
          }
        }
        else {
          std::__cxx11::string::_M_append
                    ((char *)&local_3c8,(ulong)(pIVar17->Value)._M_dataplus._M_p);
        }
        std::__cxx11::string::append((char *)&local_3c8);
      }
      pIVar17 = pIVar17 + 1;
    } while (pIVar17 !=
             (pIVar13->
             super__Vector_base<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>
             )._M_impl.super__Vector_impl_data._M_finish);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,local_3c8,(long)local_3c0)
  ;
  if ((local_428->RuntimeSep)._M_string_length == 0) {
    local_3f8._0_8_ = (string *)0x0;
    local_3f8._8_8_ = (string *)0x0;
    local_3f8._16_8_ = (pointer)0x0;
    cmComputeLinkInformation::GetRPath
              (local_428,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_3f8,local_3fc._0_1_);
    local_450._M_dataplus._M_p = (pointer)&local_450.field_2;
    local_450._M_string_length = 0;
    local_450.field_2._M_local_buf[0] = '\0';
    if (local_3f8._0_8_ != local_3f8._8_8_) {
      pcVar1 = &local_430->super_cmOutputConverter;
      psVar15 = (string *)local_3f8._0_8_;
      do {
        std::__cxx11::string::_M_append
                  ((char *)&local_450,(ulong)(local_428->RuntimeFlag)._M_dataplus._M_p);
        cmOutputConverter::Convert(&local_420,pcVar1,psVar15,NONE,local_400);
        std::__cxx11::string::_M_append((char *)&local_450,(ulong)local_420._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_420._M_dataplus._M_p != &local_420.field_2) {
          operator_delete(local_420._M_dataplus._M_p,local_420.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::string::append((char *)&local_450);
        psVar15 = psVar15 + 1;
      } while (psVar15 != (string *)local_3f8._8_8_);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,local_450._M_dataplus._M_p,local_450._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_450._M_dataplus._M_p != &local_450.field_2) {
      operator_delete(local_450._M_dataplus._M_p,
                      CONCAT71(local_450.field_2._M_allocated_capacity._1_7_,
                               local_450.field_2._M_local_buf[0]) + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_3f8);
  }
  else {
    cmComputeLinkInformation::GetRPathString_abi_cxx11_(&local_450,local_428,local_3fc._0_1_);
    if (local_450._M_string_length != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,(local_428->RuntimeFlag)._M_dataplus._M_p,
                 (local_428->RuntimeFlag)._M_string_length);
      cmOutputConverter::EscapeForShell
                (&local_420,&local_430->super_cmOutputConverter,&local_450,!forResponseFile,false,
                 false);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,local_420._M_dataplus._M_p,local_420._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_420._M_dataplus._M_p != &local_420.field_2) {
        operator_delete(local_420._M_dataplus._M_p,local_420.field_2._M_allocated_capacity + 1);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," ",1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_450._M_dataplus._M_p != &local_450.field_2) {
      operator_delete(local_450._M_dataplus._M_p,
                      CONCAT71(local_450.field_2._M_allocated_capacity._1_7_,
                               local_450.field_2._M_local_buf[0]) + 1);
    }
  }
  pcVar10 = local_428;
  cmComputeLinkInformation::GetRPathLinkString_abi_cxx11_(&local_450,local_428);
  sVar4 = (pcVar10->RPathLinkFlag)._M_string_length;
  if ((sVar4 != 0) && (local_450._M_string_length != 0)) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,(local_428->RPathLinkFlag)._M_dataplus._M_p,sVar4);
    cmOutputConverter::EscapeForShell
              (&local_420,&local_430->super_cmOutputConverter,&local_450,!forResponseFile,false,
               false);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,local_420._M_dataplus._M_p,local_420._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_420._M_dataplus._M_p != &local_420.field_2) {
      operator_delete(local_420._M_dataplus._M_p,local_420.field_2._M_allocated_capacity + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," ",1);
  }
  local_420._M_dataplus._M_p = (pointer)&local_420.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_420,"CMAKE_","");
  psVar15 = (string *)(local_3f8 + 0x10);
  pcVar5 = (local_428->LinkLanguage)._M_dataplus._M_p;
  local_3f8._0_8_ = psVar15;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_3f8,pcVar5,pcVar5 + (local_428->LinkLanguage)._M_string_length);
  std::__cxx11::string::_M_append((char *)&local_420,local_3f8._0_8_);
  if ((string *)local_3f8._0_8_ != psVar15) {
    operator_delete((void *)local_3f8._0_8_,
                    (ulong)((long)&((_Alloc_hider *)local_3f8._16_8_)->_M_p + 1));
  }
  std::__cxx11::string::append((char *)&local_420);
  pcVar9 = cmMakefile::GetDefinition(local_430->Makefile,&local_420);
  if (pcVar9 != (char *)0x0) {
    sVar14 = strlen(pcVar9);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar9,sVar14);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," ",1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)local_388,(string *)local_3f8);
  if ((string *)local_3f8._0_8_ != psVar15) {
    operator_delete((void *)local_3f8._0_8_,
                    (ulong)((long)&((_Alloc_hider *)local_3f8._16_8_)->_M_p + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_420._M_dataplus._M_p != &local_420.field_2) {
    operator_delete(local_420._M_dataplus._M_p,local_420.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_450._M_dataplus._M_p != &local_450.field_2) {
    operator_delete(local_450._M_dataplus._M_p,
                    CONCAT71(local_450.field_2._M_allocated_capacity._1_7_,
                             local_450.field_2._M_local_buf[0]) + 1);
  }
  if ((undefined1 *)local_360._0_8_ != local_360 + 0x10) {
    operator_delete((void *)local_360._0_8_,local_360._16_8_ + 1);
  }
  if (local_380[0] != local_370) {
    operator_delete(local_380[0],local_370[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  if (local_3a8[0] != local_398) {
    operator_delete(local_3a8[0],local_398[0] + 1);
  }
  if (local_3c8 != &local_3b8) {
    operator_delete(local_3c8,CONCAT71(uStack_3b7,local_3b8) + 1);
  }
LAB_002cba26:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  return;
}

Assistant:

void cmLocalGenerator::OutputLinkLibraries(std::string& linkLibraries,
                                           std::string& frameworkPath,
                                           std::string& linkPath,
                                           cmGeneratorTarget &tgt,
                                           bool relink,
                                           bool forResponseFile,
                                           bool useWatcomQuote)
{
  OutputFormat shellFormat = (forResponseFile) ? RESPONSE :
                             ((useWatcomQuote) ? WATCOMQUOTE : SHELL);
  bool escapeAllowMakeVars = !forResponseFile;
  std::ostringstream fout;
  std::string config = this->Makefile->GetSafeDefinition("CMAKE_BUILD_TYPE");
  cmComputeLinkInformation* pcli = tgt.GetLinkInformation(config);
  if(!pcli)
    {
    return;
    }
  cmComputeLinkInformation& cli = *pcli;

  // Collect library linking flags command line options.
  std::string linkLibs;

  std::string linkLanguage = cli.GetLinkLanguage();

  std::string libPathFlag =
    this->Makefile->GetRequiredDefinition("CMAKE_LIBRARY_PATH_FLAG");
  std::string libPathTerminator =
    this->Makefile->GetSafeDefinition("CMAKE_LIBRARY_PATH_TERMINATOR");

  // Flags to link an executable to shared libraries.
  if (tgt.GetType() == cmState::EXECUTABLE &&
      this->StateSnapshot.GetState()->
        GetGlobalPropertyAsBool("TARGET_SUPPORTS_SHARED_LIBS"))
    {
    bool add_shlib_flags = false;
    switch(tgt.GetPolicyStatusCMP0065())
      {
      case cmPolicies::WARN:
        if(!tgt.GetPropertyAsBool("ENABLE_EXPORTS") &&
           this->Makefile->PolicyOptionalWarningEnabled(
             "CMAKE_POLICY_WARNING_CMP0065"))
          {
          std::ostringstream w;
          w << cmPolicies::GetPolicyWarning(cmPolicies::CMP0065) << "\n"
            "For compatibility with older versions of CMake, "
            "additional flags may be added to export symbols on all "
            "executables regardless of thier ENABLE_EXPORTS property.";
          this->Makefile->IssueMessage(cmake::AUTHOR_WARNING, w.str());
          }
      case cmPolicies::OLD:
        // OLD behavior is to always add the flags
        add_shlib_flags = true;
        break;
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS:
        this->Makefile->IssueMessage(
          cmake::FATAL_ERROR,
          cmPolicies::GetRequiredPolicyError(cmPolicies::CMP0065)
          );
      case cmPolicies::NEW:
        // NEW behavior is to only add the flags if ENABLE_EXPORTS is on
        add_shlib_flags = tgt.GetPropertyAsBool("ENABLE_EXPORTS");
        break;
      }

    if(add_shlib_flags)
      {
      std::string linkFlagsVar = "CMAKE_SHARED_LIBRARY_LINK_";
      linkFlagsVar += linkLanguage;
      linkFlagsVar += "_FLAGS";
      linkLibs = this->Makefile->GetSafeDefinition(linkFlagsVar);
      linkLibs += " ";
      }
    }

  // Append the framework search path flags.
  std::string fwSearchFlagVar = "CMAKE_";
  fwSearchFlagVar += linkLanguage;
  fwSearchFlagVar += "_FRAMEWORK_SEARCH_FLAG";
  const char* fwSearchFlag =
    this->Makefile->GetDefinition(fwSearchFlagVar);
  if(fwSearchFlag && *fwSearchFlag)
    {
    std::vector<std::string> const& fwDirs = cli.GetFrameworkPaths();
    for(std::vector<std::string>::const_iterator fdi = fwDirs.begin();
        fdi != fwDirs.end(); ++fdi)
      {
      frameworkPath += fwSearchFlag;
      frameworkPath += this->Convert(*fdi, NONE, shellFormat);
      frameworkPath += " ";
      }
    }

  // Append the library search path flags.
  std::vector<std::string> const& libDirs = cli.GetDirectories();
  for(std::vector<std::string>::const_iterator libDir = libDirs.begin();
      libDir != libDirs.end(); ++libDir)
    {
    std::string libpath = this->ConvertToOutputForExisting(*libDir,
                                                           START_OUTPUT,
                                                           shellFormat);
    linkPath += " " + libPathFlag;
    linkPath += libpath;
    linkPath += libPathTerminator;
    linkPath += " ";
    }

  // Append the link items.
  typedef cmComputeLinkInformation::ItemVector ItemVector;
  ItemVector const& items = cli.GetItems();
  for(ItemVector::const_iterator li = items.begin(); li != items.end(); ++li)
    {
    if(li->Target && li->Target->GetType() == cmState::INTERFACE_LIBRARY)
      {
      continue;
      }
    if(li->IsPath)
      {
      linkLibs += this->ConvertToLinkReference(li->Value, shellFormat);
      }
    else
      {
      linkLibs += li->Value;
      }
    linkLibs += " ";
    }

  // Write the library flags to the build rule.
  fout << linkLibs;

  // Check what kind of rpath flags to use.
  if(cli.GetRuntimeSep().empty())
    {
    // Each rpath entry gets its own option ("-R a -R b -R c")
    std::vector<std::string> runtimeDirs;
    cli.GetRPath(runtimeDirs, relink);

    std::string rpath;
    for(std::vector<std::string>::iterator ri = runtimeDirs.begin();
        ri != runtimeDirs.end(); ++ri)
      {
      rpath += cli.GetRuntimeFlag();
      rpath += this->Convert(*ri, NONE, shellFormat);
      rpath += " ";
      }
    fout << rpath;
    }
  else
    {
    // All rpath entries are combined ("-Wl,-rpath,a:b:c").
    std::string rpath = cli.GetRPathString(relink);

    // Store the rpath option in the stream.
    if(!rpath.empty())
      {
      fout << cli.GetRuntimeFlag();
      fout << this->EscapeForShell(rpath, escapeAllowMakeVars);
      fout << " ";
      }
    }

  // Add the linker runtime search path if any.
  std::string rpath_link = cli.GetRPathLinkString();
  if(!cli.GetRPathLinkFlag().empty() && !rpath_link.empty())
    {
    fout << cli.GetRPathLinkFlag();
    fout << this->EscapeForShell(rpath_link, escapeAllowMakeVars);
    fout << " ";
    }

  // Add standard libraries for this language.
  std::string standardLibsVar = "CMAKE_";
  standardLibsVar += cli.GetLinkLanguage();
  standardLibsVar += "_STANDARD_LIBRARIES";
  if(const char* stdLibs =
     this->Makefile->GetDefinition(standardLibsVar))
    {
    fout << stdLibs << " ";
    }

  linkLibraries = fout.str();
}